

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ostream.h
# Opt level: O0

NetInterface * operator<<(NetInterface *sink,uint i)

{
  char local_15;
  uint local_14;
  char c;
  NetInterface *pNStack_10;
  uint i_local;
  NetInterface *sink_local;
  
  local_14 = i;
  pNStack_10 = sink;
  if (9 < i) {
    operator<<(sink,i / 10);
  }
  local_15 = (char)((ulong)local_14 % 10) + '0';
  (*pNStack_10->_vptr_NetInterface[4])(pNStack_10,&local_15,1);
  return pNStack_10;
}

Assistant:

T& operator<<( T& sink, unsigned int i )
{
  // Handle digits that aren't the lowest digit (if any)
  if ( i >= 10 )
  {
    sink << i/10;
  }

  // Handle the lowest digit
  char c = '0' + (i % 10);
  sink.write( &c, 1 );

  return sink;
}